

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLElement * __thiscall tinyxml2::XMLNode::FirstChildElement(XMLNode *this,char *name)

{
  XMLNode *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  XMLElement *pXVar3;
  
  pXVar1 = this->_firstChild;
  do {
    if (pXVar1 == (XMLNode *)0x0) {
      return (XMLElement *)0x0;
    }
    iVar2 = (*pXVar1->_vptr_XMLNode[6])(pXVar1);
    pXVar3 = (XMLElement *)CONCAT44(extraout_var,iVar2);
    if (pXVar3 != (XMLElement *)0x0) {
      if (name == (char *)0x0) {
        return pXVar3;
      }
      iVar2 = (*(pXVar3->super_XMLNode)._vptr_XMLNode[9])(pXVar3);
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        pcVar4 = StrPair::GetStr(&(pXVar3->super_XMLNode)._value);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      if (pcVar4 == name) {
        return pXVar3;
      }
      cVar7 = *pcVar4;
      pcVar6 = name;
      if (cVar7 != '\0') {
        lVar5 = 0;
        do {
          if ((cVar7 != name[lVar5]) || ((int)lVar5 == 0x7fffffff)) {
            if ((int)lVar5 == 0x7fffffff) {
              return pXVar3;
            }
            goto LAB_001ba2bb;
          }
          cVar7 = pcVar4[lVar5 + 1];
          lVar5 = lVar5 + 1;
        } while (cVar7 != '\0');
        if ((int)lVar5 == 0x7fffffff) {
          return pXVar3;
        }
        pcVar6 = name + lVar5;
      }
      if (*pcVar6 == '\0') {
        return pXVar3;
      }
    }
LAB_001ba2bb:
    pXVar1 = pXVar1->_next;
  } while( true );
}

Assistant:

const XMLElement* XMLNode::FirstChildElement( const char* name ) const
{
    for( const XMLNode* node = _firstChild; node; node = node->_next ) {
        const XMLElement* element = node->ToElement();
        if ( element ) {
            if ( !name || XMLUtil::StringEqual( element->Name(), name ) ) {
                return element;
            }
        }
    }
    return 0;
}